

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMLSParserImpl.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::DOMLSParserImpl::setParameter(DOMLSParserImpl *this,XMLCh *name,bool state)

{
  XMLScanner *pXVar1;
  int iVar2;
  ValSchemes VVar3;
  DOMException *this_00;
  
  iVar2 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgDOMCharsetOverridesXMLEncoding);
  if (iVar2 == 0) {
    this->fCharsetOverridesXMLEncoding = state;
    return;
  }
  iVar2 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgDOMDisallowDoctype);
  if (iVar2 == 0) {
    ((this->super_AbstractDOMParser).fScanner)->fDisallowDTD = state;
    return;
  }
  iVar2 = XMLString::compareIStringASCII
                    (name,(XMLCh *)XMLUni::fgDOMIgnoreUnknownCharacterDenormalization);
  if (iVar2 == 0) {
    return;
  }
  iVar2 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgDOMNamespaces);
  if (iVar2 == 0) {
    AbstractDOMParser::setDoNamespaces(&this->super_AbstractDOMParser,state);
    return;
  }
  iVar2 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgDOMSupportedMediatypesOnly);
  if (iVar2 == 0) {
    if (!state) {
      return;
    }
    this_00 = (DOMException *)__cxa_allocate_exception(0x28);
    DOMException::DOMException(this_00,9,0,(this->super_AbstractDOMParser).fMemoryManager);
LAB_002d9b6e:
    __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
  }
  iVar2 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgDOMValidate);
  if (iVar2 == 0) {
    if (state) {
      VVar3 = AbstractDOMParser::getValidationScheme(&this->super_AbstractDOMParser);
      if (VVar3 != Val_Never) {
        return;
      }
      VVar3 = Val_Always;
      goto LAB_002d9bb3;
    }
  }
  else {
    iVar2 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgDOMValidateIfSchema);
    if (iVar2 != 0) {
      iVar2 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgDOMWellFormed);
      if (iVar2 == 0) {
        if (state) {
          return;
        }
        this_00 = (DOMException *)__cxa_allocate_exception(0x28);
        DOMException::DOMException(this_00,9,0,(this->super_AbstractDOMParser).fMemoryManager);
      }
      else {
        iVar2 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgDOMCanonicalForm);
        if (iVar2 == 0) {
          return;
        }
        iVar2 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgDOMCDATASections);
        if (iVar2 == 0) {
          return;
        }
        iVar2 = XMLString::compareIStringASCII
                          (name,(XMLCh *)XMLUni::fgDOMCheckCharacterNormalization);
        if (iVar2 == 0) {
          return;
        }
        iVar2 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgDOMComments);
        if (iVar2 == 0) {
          (this->super_AbstractDOMParser).fCreateCommentNodes = state;
          return;
        }
        iVar2 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgDOMDatatypeNormalization);
        if (iVar2 == 0) {
          ((this->super_AbstractDOMParser).fScanner)->fNormalizeData = state;
          return;
        }
        iVar2 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgDOMElementContentWhitespace);
        if (iVar2 == 0) {
          (this->super_AbstractDOMParser).fIncludeIgnorableWhitespace = state;
          return;
        }
        iVar2 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgDOMEntities);
        if (iVar2 == 0) {
          (this->super_AbstractDOMParser).fCreateEntityReferenceNodes = state;
          return;
        }
        iVar2 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgDOMNamespaceDeclarations);
        if (iVar2 == 0) {
          if (state) {
            return;
          }
          this_00 = (DOMException *)__cxa_allocate_exception(0x28);
          DOMException::DOMException(this_00,9,0,(this->super_AbstractDOMParser).fMemoryManager);
        }
        else {
          iVar2 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgDOMNormalizeCharacters);
          if (iVar2 == 0) {
            return;
          }
          iVar2 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgDOMSplitCDATASections);
          if (iVar2 == 0) {
            return;
          }
          iVar2 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgDOMInfoset);
          if (iVar2 == 0) {
            if (state) {
              return;
            }
            this_00 = (DOMException *)__cxa_allocate_exception(0x28);
            DOMException::DOMException(this_00,9,0,(this->super_AbstractDOMParser).fMemoryManager);
          }
          else {
            iVar2 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgXercesSchema);
            if (iVar2 == 0) {
              AbstractDOMParser::setDoSchema(&this->super_AbstractDOMParser,state);
              return;
            }
            iVar2 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgXercesSchemaFullChecking)
            ;
            if (iVar2 == 0) {
              AbstractDOMParser::setValidationSchemaFullChecking
                        (&this->super_AbstractDOMParser,state);
              return;
            }
            iVar2 = XMLString::compareIStringASCII
                              (name,(XMLCh *)XMLUni::fgXercesUserAdoptsDOMDocument);
            if (iVar2 == 0) {
              if (state) {
                this->fUserAdoptsDocument = true;
                return;
              }
              this->fUserAdoptsDocument = false;
              return;
            }
            iVar2 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgXercesLoadExternalDTD);
            if (iVar2 == 0) {
              AbstractDOMParser::setLoadExternalDTD(&this->super_AbstractDOMParser,state);
              return;
            }
            iVar2 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgXercesLoadSchema);
            if (iVar2 == 0) {
              AbstractDOMParser::setLoadSchema(&this->super_AbstractDOMParser,state);
              return;
            }
            iVar2 = XMLString::compareIStringASCII
                              (name,(XMLCh *)XMLUni::fgXercesContinueAfterFatalError);
            if (iVar2 == 0) {
              AbstractDOMParser::setExitOnFirstFatalError(&this->super_AbstractDOMParser,!state);
              return;
            }
            iVar2 = XMLString::compareIStringASCII
                              (name,(XMLCh *)XMLUni::fgXercesValidationErrorAsFatal);
            if (iVar2 == 0) {
              AbstractDOMParser::setValidationConstraintFatal(&this->super_AbstractDOMParser,state);
              return;
            }
            iVar2 = XMLString::compareIStringASCII
                              (name,(XMLCh *)XMLUni::fgXercesCacheGrammarFromParse);
            if (iVar2 == 0) {
              pXVar1 = (this->super_AbstractDOMParser).fScanner;
              pXVar1->fToCacheGrammar = state;
              if (!state) {
                return;
              }
              pXVar1->fUseCachedGrammar = true;
              return;
            }
            iVar2 = XMLString::compareIStringASCII
                              (name,(XMLCh *)XMLUni::fgXercesUseCachedGrammarInParse);
            if (iVar2 == 0) {
              pXVar1 = (this->super_AbstractDOMParser).fScanner;
              if ((!state) && (pXVar1->fToCacheGrammar != false)) {
                return;
              }
              pXVar1->fUseCachedGrammar = state;
              return;
            }
            iVar2 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgXercesCalculateSrcOfs);
            if (iVar2 == 0) {
              ((this->super_AbstractDOMParser).fScanner)->fCalculateSrcOfs = state;
              return;
            }
            iVar2 = XMLString::compareIStringASCII
                              (name,(XMLCh *)XMLUni::fgXercesStandardUriConformant);
            if (iVar2 == 0) {
              pXVar1 = (this->super_AbstractDOMParser).fScanner;
              pXVar1->fStandardUriConformant = state;
              (pXVar1->fReaderMgr).fStandardUriConformant = state;
              return;
            }
            iVar2 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgXercesDOMHasPSVIInfo);
            if (iVar2 == 0) {
              AbstractDOMParser::setCreateSchemaInfo(&this->super_AbstractDOMParser,state);
              return;
            }
            iVar2 = XMLString::compareIStringASCII
                              (name,(XMLCh *)XMLUni::fgXercesGenerateSyntheticAnnotations);
            if (iVar2 == 0) {
              ((this->super_AbstractDOMParser).fScanner)->fGenerateSyntheticAnnotations = state;
              return;
            }
            iVar2 = XMLString::compareIStringASCII
                              (name,(XMLCh *)XMLUni::fgXercesValidateAnnotations);
            if (iVar2 == 0) {
              ((this->super_AbstractDOMParser).fScanner)->fValidateAnnotations = state;
              return;
            }
            iVar2 = XMLString::compareIStringASCII
                              (name,(XMLCh *)XMLUni::fgXercesIdentityConstraintChecking);
            if (iVar2 == 0) {
              ((this->super_AbstractDOMParser).fScanner)->fIdentityConstraintChecking = state;
              return;
            }
            iVar2 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgXercesIgnoreCachedDTD);
            if (iVar2 == 0) {
              ((this->super_AbstractDOMParser).fScanner)->fIgnoreCachedDTD = state;
              return;
            }
            iVar2 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgXercesIgnoreAnnotations);
            if (iVar2 == 0) {
              ((this->super_AbstractDOMParser).fScanner)->fIgnoreAnnotations = state;
              return;
            }
            iVar2 = XMLString::compareIStringASCII
                              (name,(XMLCh *)XMLUni::fgXercesDisableDefaultEntityResolution);
            if (iVar2 == 0) {
              ((this->super_AbstractDOMParser).fScanner)->fDisableDefaultEntityResolution = state;
              return;
            }
            iVar2 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgXercesSkipDTDValidation);
            if (iVar2 == 0) {
              ((this->super_AbstractDOMParser).fScanner)->fSkipDTDValidation = state;
              return;
            }
            iVar2 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgXercesDoXInclude);
            if (iVar2 == 0) {
              (this->super_AbstractDOMParser).fDoXInclude = state;
              return;
            }
            iVar2 = XMLString::compareIStringASCII
                              (name,(XMLCh *)XMLUni::fgXercesHandleMultipleImports);
            if (iVar2 == 0) {
              ((this->super_AbstractDOMParser).fScanner)->fHandleMultipleImports = state;
              return;
            }
            this_00 = (DOMException *)__cxa_allocate_exception(0x28);
            DOMException::DOMException(this_00,8,0,(this->super_AbstractDOMParser).fMemoryManager);
          }
        }
      }
      goto LAB_002d9b6e;
    }
    if (state) {
      VVar3 = Val_Auto;
      goto LAB_002d9bb3;
    }
  }
  VVar3 = Val_Never;
LAB_002d9bb3:
  AbstractDOMParser::setValidationScheme(&this->super_AbstractDOMParser,VVar3);
  return;
}

Assistant:

void DOMLSParserImpl::setParameter(const XMLCh* name, bool state)
{
    if (XMLString::compareIStringASCII(name, XMLUni::fgDOMCharsetOverridesXMLEncoding) == 0)
    {
        // in fact, setting this has no effect to the parser
        fCharsetOverridesXMLEncoding = state;
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgDOMDisallowDoctype) == 0)
    {
        getScanner()->setDisallowDTD(state);
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgDOMIgnoreUnknownCharacterDenormalization) == 0)
    {
        // TODO
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgDOMNamespaces) == 0)
    {
        setDoNamespaces(state);
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgDOMSupportedMediatypesOnly) == 0)
    {
        if (state)
            throw DOMException(DOMException::NOT_SUPPORTED_ERR, 0, getMemoryManager());
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgDOMValidate) == 0)
    {
        if (state) {
            if (getValidationScheme() == AbstractDOMParser::Val_Never)
                setValidationScheme(AbstractDOMParser::Val_Always);
        }
        else {
            setValidationScheme(AbstractDOMParser::Val_Never);
        }
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgDOMValidateIfSchema) == 0)
    {
        if (state) {
            setValidationScheme(AbstractDOMParser::Val_Auto);
        }
        else {
            setValidationScheme(AbstractDOMParser::Val_Never);
        }
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgDOMWellFormed) == 0)
    {
        if(state==false)
            throw DOMException(DOMException::NOT_SUPPORTED_ERR, 0, getMemoryManager());
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgDOMCanonicalForm) == 0 )
    {
        // TODO
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgDOMCDATASections) == 0 )
    {
        // TODO
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgDOMCheckCharacterNormalization) == 0 )
    {
        // TODO
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgDOMComments) == 0)
    {
        setCreateCommentNodes(state);
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgDOMDatatypeNormalization) == 0)
    {
        getScanner()->setNormalizeData(state);
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgDOMElementContentWhitespace) == 0)
    {
        setIncludeIgnorableWhitespace(state);
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgDOMEntities) == 0)
    {
        setCreateEntityReferenceNodes(state);
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgDOMNamespaceDeclarations) == 0)
    {
        if (state==false)
            throw DOMException(DOMException::NOT_SUPPORTED_ERR, 0, getMemoryManager());
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgDOMNormalizeCharacters) == 0)
    {
        // TODO
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgDOMSplitCDATASections) == 0)
    {
        // TODO
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgDOMInfoset) == 0)
    {
        if (!state)
            throw DOMException(DOMException::NOT_SUPPORTED_ERR, 0, getMemoryManager());
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgXercesSchema) == 0)
    {
        setDoSchema(state);
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgXercesSchemaFullChecking) == 0)
    {
        setValidationSchemaFullChecking(state);
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgXercesUserAdoptsDOMDocument) == 0)
    {
        if(state)
            fUserAdoptsDocument = true;
        else
            fUserAdoptsDocument = false;
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgXercesLoadExternalDTD) == 0)
    {
        setLoadExternalDTD(state);
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgXercesLoadSchema) == 0)
    {
        setLoadSchema(state);
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgXercesContinueAfterFatalError) == 0)
    {
        setExitOnFirstFatalError(!state);
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgXercesValidationErrorAsFatal) == 0)
    {
        setValidationConstraintFatal(state);
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgXercesCacheGrammarFromParse) == 0)
    {
        getScanner()->cacheGrammarFromParse(state);

        if (state)
            getScanner()->useCachedGrammarInParse(state);
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgXercesUseCachedGrammarInParse) == 0)
    {
        if (state || !getScanner()->isCachingGrammarFromParse())
            getScanner()->useCachedGrammarInParse(state);
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgXercesCalculateSrcOfs) == 0)
    {
        getScanner()->setCalculateSrcOfs(state);
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgXercesStandardUriConformant) == 0)
    {
        getScanner()->setStandardUriConformant(state);
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgXercesDOMHasPSVIInfo) == 0)
    {
        setCreateSchemaInfo(state);
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgXercesGenerateSyntheticAnnotations) == 0)
    {
        getScanner()->setGenerateSyntheticAnnotations(state);
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgXercesValidateAnnotations) == 0)
    {
        getScanner()->setValidateAnnotations(state);
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgXercesIdentityConstraintChecking) == 0)
    {
        getScanner()->setIdentityConstraintChecking(state);
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgXercesIgnoreCachedDTD) == 0)
    {
        getScanner()->setIgnoredCachedDTD(state);
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgXercesIgnoreAnnotations) == 0)
    {
        getScanner()->setIgnoreAnnotations(state);
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgXercesDisableDefaultEntityResolution) == 0)
    {
        getScanner()->setDisableDefaultEntityResolution(state);
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgXercesSkipDTDValidation) == 0)
    {
        getScanner()->setSkipDTDValidation(state);
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgXercesDoXInclude) == 0)
    {
        setDoXInclude(state);
    }
    else if (XMLString::compareIStringASCII(name, XMLUni::fgXercesHandleMultipleImports) == 0)
    {
        getScanner()->setHandleMultipleImports(state);
    }
    else
        throw DOMException(DOMException::NOT_FOUND_ERR, 0, getMemoryManager());
}